

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffd50;
  Mat *m;
  Mat *in_stack_fffffffffffffd58;
  Mat *this_00;
  Mat local_268;
  Mat local_220;
  undefined1 local_1d8 [72];
  undefined1 local_190 [72];
  undefined1 local_148 [72];
  undefined1 local_100 [72];
  undefined1 local_b8 [88];
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,*(undefined4 *)(in_RDI + 0xd8),0);
  ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  ncnn::Mat::~Mat((Mat *)0x90849f);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    (**(code **)(*local_18 + 0x10))(local_b8,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
    ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    ncnn::Mat::~Mat((Mat *)0x90853f);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      (**(code **)(*local_18 + 0x10))(local_100,local_18,*(undefined4 *)(in_RDI + 0xd8),0);
      ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      ncnn::Mat::~Mat((Mat *)0x9085dc);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        (**(code **)(*local_18 + 0x10))(local_148,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        ncnn::Mat::~Mat((Mat *)0x90867c);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          (**(code **)(*local_18 + 0x10))(local_190,local_18,*(undefined4 *)(in_RDI + 0xd8),0);
          ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
          ncnn::Mat::~Mat((Mat *)0x908719);
          bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
          if (bVar1) {
            local_4 = -100;
          }
          else {
            (**(code **)(*local_18 + 0x10))(local_1d8,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
            ncnn::Mat::operator=(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
            ncnn::Mat::~Mat((Mat *)0x9087b9);
            bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
            if (bVar1) {
              local_4 = -100;
            }
            else {
              this_00 = &local_220;
              (**(code **)(*local_18 + 0x10))(this_00,local_18,*(undefined4 *)(in_RDI + 0xd8),0);
              ncnn::Mat::operator=(this_00,in_stack_fffffffffffffd50);
              ncnn::Mat::~Mat((Mat *)0x908856);
              bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd50);
              if (bVar1) {
                local_4 = -100;
              }
              else {
                m = &local_268;
                (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
                ncnn::Mat::operator=(this_00,m);
                ncnn::Mat::~Mat((Mat *)0x9088f0);
                bVar1 = ncnn::Mat::empty(m);
                if (bVar1) {
                  local_4 = -100;
                }
                else {
                  local_4 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}